

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directize.cpp
# Opt level: O1

IndirectCallInfo * __thiscall
wasm::anon_unknown_157::FunctionDirectizer::getTargetInfo
          (IndirectCallInfo *__return_storage_ptr__,FunctionDirectizer *this,Expression *target,
          TableInfo *table,CallIndirect *original)

{
  FlatTable *pFVar1;
  long lVar2;
  char *pcVar3;
  size_t sVar4;
  uint64_t uVar5;
  Function *pFVar6;
  __index_type _Var7;
  Name name;
  
  if (target->_id == ConstId) {
    uVar5 = Literal::getUnsigned((Literal *)(target + 1));
    pFVar1 = (table->flatTable)._M_t.
             super___uniq_ptr_impl<wasm::TableUtils::FlatTable,_std::default_delete<wasm::TableUtils::FlatTable>_>
             ._M_t.
             super__Tuple_impl<0UL,_wasm::TableUtils::FlatTable_*,_std::default_delete<wasm::TableUtils::FlatTable>_>
             .super__Head_base<0UL,_wasm::TableUtils::FlatTable_*,_false>._M_head_impl;
    lVar2 = *(long *)&(pFVar1->names).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>;
    if (uVar5 < (ulong)((long)*(pointer *)
                               ((long)&(pFVar1->names).
                                       super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_> +
                               8) - lVar2 >> 4)) {
      pcVar3 = *(char **)(lVar2 + 8 + uVar5 * 0x10);
      _Var7 = '\x01';
      if (pcVar3 != (char *)0x0) {
        sVar4 = *(size_t *)(lVar2 + uVar5 * 0x10);
        name.super_IString.str._M_str = pcVar3;
        name.super_IString.str._M_len = sVar4;
        pFVar6 = Module::getFunction((this->
                                     super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionDirectizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionDirectizer,_void>_>_>
                                     ).
                                     super_PostWalker<wasm::(anonymous_namespace)::FunctionDirectizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionDirectizer,_void>_>
                                     .
                                     super_Walker<wasm::(anonymous_namespace)::FunctionDirectizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionDirectizer,_void>_>
                                     .currModule,name);
        if ((original->heapType).id == (pFVar6->type).id) {
          *(size_t *)
           &(__return_storage_ptr__->
            super__Variant_base<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
            ).
            super__Move_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
            .
            super__Copy_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
            .
            super__Move_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
            .
            super__Copy_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
            .
            super__Variant_storage_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
            ._M_u = sVar4;
          *(char **)((long)&(__return_storage_ptr__->
                            super__Variant_base<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                            ).
                            super__Move_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                            .
                            super__Copy_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                            .
                            super__Move_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                            .
                            super__Copy_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                            .
                            super__Variant_storage_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                            ._M_u + 8) = pcVar3;
          _Var7 = '\x02';
        }
      }
      goto LAB_0085dc74;
    }
    _Var7 = '\x01';
    if (table->mayBeModified != true) goto LAB_0085dc74;
    if (table->initialContentsImmutable == false) {
      __assert_fail("table.initialContentsImmutable",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Directize.cpp"
                    ,0x93,
                    "CallUtils::IndirectCallInfo wasm::(anonymous namespace)::FunctionDirectizer::getTargetInfo(Expression *, const TableInfo &, CallIndirect *)"
                   );
    }
  }
  _Var7 = '\0';
LAB_0085dc74:
  (__return_storage_ptr__->
  super__Variant_base<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>).
  super__Move_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>.
  super__Copy_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>.
  super__Move_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>.
  super__Copy_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>.
  super__Variant_storage_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
  ._M_index = _Var7;
  return __return_storage_ptr__;
}

Assistant:

CallUtils::IndirectCallInfo getTargetInfo(Expression* target,
                                            const TableInfo& table,
                                            CallIndirect* original) {
    auto* c = target->dynCast<Const>();
    if (!c) {
      return CallUtils::Unknown{};
    }

    Address index = c->value.getUnsigned();

    // Check if index is invalid, or the type is wrong.
    auto& flatTable = *table.flatTable;
    if (index >= flatTable.names.size()) {
      // The index is out of bounds for the initial table's content. This may
      // trap, but it may also not trap if the table is modified later (if a
      // function is appended to it).
      if (!table.mayBeModified) {
        return CallUtils::Trap{};
      } else {
        // The table may be modified, so it might be appended to. We should only
        // get here in the case that the initial contents are immutable, as
        // otherwise we have nothing to optimize at all.
        assert(table.initialContentsImmutable);
        return CallUtils::Unknown{};
      }
    }
    auto name = flatTable.names[index];
    if (!name.is()) {
      return CallUtils::Trap{};
    }
    auto* func = getModule()->getFunction(name);
    if (original->heapType != func->type) {
      return CallUtils::Trap{};
    }
    return CallUtils::Known{name};
  }